

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

string * __thiscall Character::SourceName_abi_cxx11_(string *__return_storage_ptr__,Character *this)

{
  string *psVar1;
  
  psVar1 = (string *)&this->faux_name;
  if ((this->faux_name)._M_string_length == 0) {
    psVar1 = (string *)&this->real_name;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,psVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Character::SourceName() const
{
	return faux_name.empty() ? real_name : faux_name;
}